

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O0

int anon_unknown.dwarf_7314::RtMidi_openport(lua_State *L)

{
  int iVar1;
  RtMidi *pRVar2;
  allocator<char> local_39;
  string local_38 [32];
  RtMidi *local_18;
  RtMidi *self;
  lua_State *L_local;
  
  self = (RtMidi *)L;
  pRVar2 = getRtMidi(L,1);
  local_18 = pRVar2;
  iVar1 = luaL_optinteger(self,2,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"RtMidi",&local_39);
  (**pRVar2->_vptr_RtMidi)(pRVar2,(ulong)(iVar1 - 1),local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return 0;
}

Assistant:

int RtMidi_openport(lua_State *L) {
	auto &self = getRtMidi(L, 1);
	self.openPort(static_cast<unsigned>(luaL_optinteger(L, 2, 1)) - 1);
	return 0;
}